

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushItemWidth(float item_width)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar1->ItemWidthDefault;
  }
  (pIVar1->DC).ItemWidth = item_width;
  ImVector<float>::push_back(&(pIVar1->DC).ItemWidthStack,&(pIVar1->DC).ItemWidth);
  *(byte *)&(pIVar2->NextItemData).Flags = (byte)(pIVar2->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}